

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O3

int ncnn::cpu_support_arm_i8mm(void)

{
  try_initialize_global_cpu_info();
  return 0;
}

Assistant:

int cpu_support_arm_i8mm()
{
    try_initialize_global_cpu_info();
#if __aarch64__
#if defined _WIN32
    return g_cpu_support_arm_i8mm;
#elif defined __ANDROID__ || defined __linux__
    return g_hwcaps2 & HWCAP2_I8MM;
#elif __APPLE__
    return g_hw_optional_arm_FEAT_I8MM
           || g_hw_cpufamily == CPUFAMILY_ARM_AVALANCHE_BLIZZARD
           || g_hw_cpufamily == CPUFAMILY_ARM_EVEREST_SAWTOOTH
           || g_hw_cpufamily == CPUFAMILY_ARM_COLL
           || g_hw_cpufamily == CPUFAMILY_ARM_IBIZA
           || g_hw_cpufamily == CPUFAMILY_ARM_LOBOS
           || g_hw_cpufamily == CPUFAMILY_ARM_PALMA;
#else
    return 0;
#endif
#else
    return 0;
#endif
}